

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubf3.c
# Opt level: O0

LispPTR N_OP_ubfloat3(int arg3,LispPTR arg2,LispPTR arg1,int alpha)

{
  float flot;
  int ret;
  int degree;
  float *fptr;
  float ans;
  float val;
  int alpha_local;
  LispPTR arg1_local;
  LispPTR arg2_local;
  int arg3_local;
  
  if (alpha == 0) {
    if ((arg1 & 0xfff0000) == 0xe0000) {
      _ret = (float *)NativeAligned4FromLAddr(arg2);
      fptr._4_4_ = *_ret;
      flot = (float)(arg1 & 0xffff);
      while (flot != 0.0) {
        fptr._4_4_ = fptr._4_4_ * (float)arg3 + _ret[1];
        flot = (float)((int)flot + -1);
        _ret = _ret + 1;
      }
      if ((uint)ABS(fptr._4_4_) < 0x7f800000) {
        arg2_local = (LispPTR)fptr._4_4_;
      }
      else {
        MachineState.errorexit = 1;
        arg2_local = 0xffffffff;
        MachineState.tosvalue = arg1;
      }
    }
    else {
      MachineState.errorexit = 1;
      arg2_local = 0xffffffff;
      MachineState.tosvalue = arg1;
    }
  }
  else {
    MachineState.errorexit = 1;
    arg2_local = 0xffffffff;
    MachineState.tosvalue = arg1;
  }
  return arg2_local;
}

Assistant:

LispPTR N_OP_ubfloat3(int arg3, LispPTR arg2, LispPTR arg1, int alpha) {
  float val;
  float ans;
  float *fptr;
  int degree;
  int ret;
  float flot;

  val = *(float *)&arg3; /* why? */
  if (alpha) ERROR_EXIT(arg1);
  FPCLEAR;
  if ((arg1 & SEGMASK) != S_POSITIVE) ERROR_EXIT(arg1);
  degree = 0xFFFF & arg1;
  fptr = (float *)NativeAligned4FromLAddr(arg2);
  ans = *((float *)fptr);
  while (degree--) ans = (ans * val) + *((float *)(++fptr));
  if (FPTEST(ans)) ERROR_EXIT(arg1); /* relies on contagion of inf, nan? */
  flot = ans;
  ret = *(int *)&flot; /* why? */
  return (ret);
}